

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void enable_operator(OPL_DATA_conflict *chip,Bitu regbase,op_type_conflict *op_pt,Bit32u act_type)

{
  Bitu local_28;
  Bits wselbase;
  Bit32u act_type_local;
  op_type_conflict *op_pt_local;
  Bitu regbase_local;
  OPL_DATA_conflict *chip_local;
  
  if (op_pt->act_state == 0) {
    local_28 = regbase;
    if (0xff < (int)regbase) {
      local_28 = regbase - 0xea;
    }
    op_pt->tcount = wavestart[chip->wave_sel[(int)local_28]] << 0x10;
    op_pt->op_state = 0;
    op_pt->act_state = act_type | op_pt->act_state;
  }
  return;
}

Assistant:

static void enable_operator(OPL_DATA* chip, Bitu regbase, op_type* op_pt, Bit32u act_type)
{
	// check if this is really an off-on transition
	if (op_pt->act_state == OP_ACT_OFF)
	{
		Bits wselbase = regbase;
		if (wselbase>=ARC_SECONDSET)
			wselbase -= (ARC_SECONDSET-22);	// second set starts at 22

		op_pt->tcount = wavestart[chip->wave_sel[wselbase]]*FIXEDPT;

		// start with attack mode
		op_pt->op_state = OF_TYPE_ATT;
		op_pt->act_state |= act_type;
	}
}